

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

char * TranslateADIOS2Type2FFS(int Type)

{
  char *pcVar1;
  
  switch(Type) {
  case 1:
  case 2:
  case 3:
  case 4:
    pcVar1 = strdup("integer");
    return pcVar1;
  case 5:
  case 6:
  case 7:
  case 8:
    pcVar1 = strdup("unsigned integer");
    return pcVar1;
  case 9:
  case 10:
    pcVar1 = strdup("float");
    return pcVar1;
  default:
    return (char *)0x0;
  case 0xc:
    pcVar1 = strdup("complex4");
    return pcVar1;
  case 0xd:
    pcVar1 = strdup("complex8");
    return pcVar1;
  case 0xe:
    pcVar1 = strdup("string");
    return pcVar1;
  }
}

Assistant:

static char *TranslateADIOS2Type2FFS(const int Type)
{
    switch (Type)
    {
    case Int8:
    case Int16:
    case Int32:
    case Int64:
        return strdup("integer");
    case UInt8:
    case UInt16:
    case UInt32:
    case UInt64:
        return strdup("unsigned integer");
    case Float:
    case Double:
        return strdup("float");
    case FloatComplex:
        return strdup("complex4");
    case DoubleComplex:
        return strdup("complex8");
    case String:
        return strdup("string");
    }
    return 0;
}